

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

xmlXPathFunction xmlXPathFunctionLookupNS(xmlXPathContextPtr ctxt,xmlChar *name,xmlChar *ns_uri)

{
  xmlXPathFuncLookupFunc f;
  xmlXPathFunction ret;
  xmlChar *ns_uri_local;
  xmlChar *name_local;
  xmlXPathContextPtr ctxt_local;
  
  if (ctxt == (xmlXPathContextPtr)0x0) {
    ctxt_local = (xmlXPathContextPtr)0x0;
  }
  else if (name == (xmlChar *)0x0) {
    ctxt_local = (xmlXPathContextPtr)0x0;
  }
  else if ((ctxt->funcLookupFunc == (xmlXPathFuncLookupFunc)0x0) ||
          (ctxt_local = (xmlXPathContextPtr)
                        (*ctxt->funcLookupFunc)(ctxt->funcLookupData,name,ns_uri),
          ctxt_local == (xmlXPathContextPtr)0x0)) {
    if (ctxt->funcHash == (xmlHashTablePtr)0x0) {
      ctxt_local = (xmlXPathContextPtr)0x0;
    }
    else {
      ctxt_local = (xmlXPathContextPtr)xmlHashLookup2(ctxt->funcHash,name,ns_uri);
    }
  }
  return (xmlXPathFunction)ctxt_local;
}

Assistant:

xmlXPathFunction
xmlXPathFunctionLookupNS(xmlXPathContextPtr ctxt, const xmlChar *name,
			 const xmlChar *ns_uri) {
    xmlXPathFunction ret;

    if (ctxt == NULL)
	return(NULL);
    if (name == NULL)
	return(NULL);

    if (ctxt->funcLookupFunc != NULL) {
	xmlXPathFuncLookupFunc f;

	f = ctxt->funcLookupFunc;
	ret = f(ctxt->funcLookupData, name, ns_uri);
	if (ret != NULL)
	    return(ret);
    }

    if (ctxt->funcHash == NULL)
	return(NULL);

XML_IGNORE_PEDANTIC_WARNINGS
    ret = (xmlXPathFunction) xmlHashLookup2(ctxt->funcHash, name, ns_uri);
XML_POP_WARNINGS
    return(ret);
}